

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O0

void __thiscall
server::QServ::newcommand
          (QServ *this,char *name,char *desc,int priv,_func_void_int_char_ptr_ptr_int *callback,
          int args)

{
  int args_local;
  _func_void_int_char_ptr_ptr_int *callback_local;
  int priv_local;
  char *desc_local;
  char *name_local;
  QServ *this_local;
  
  sprintf(this->m_command[this->m_lastcommand].name,"%c%s",(ulong)(uint)(int)this->m_cmdprefix,name)
  ;
  sprintf(this->m_command[this->m_lastcommand].desc,"%s",desc);
  this->m_command[this->m_lastcommand].priv = priv;
  this->m_command[this->m_lastcommand].id = this->m_lastcommand;
  this->m_command[this->m_lastcommand].func = callback;
  this->m_command[this->m_lastcommand].args = args + 1;
  if (args < 1) {
    this->m_command[this->m_lastcommand].hasargs = false;
  }
  else {
    this->m_command[this->m_lastcommand].hasargs = true;
  }
  this->m_lastcommand = this->m_lastcommand + 1;
  return;
}

Assistant:

void QServ::newcommand(const char *name, const char *desc, int priv, void (*callback)(int, char **args, int),
                           int args) {
        sprintf(m_command[m_lastcommand].name, "%c%s", m_cmdprefix, name);
        sprintf(m_command[m_lastcommand].desc, "%s", desc);
        
        m_command[m_lastcommand].priv = priv;
        m_command[m_lastcommand].id = m_lastcommand;
        m_command[m_lastcommand].func = callback;
        m_command[m_lastcommand].args = args+1;
        
        if(args > 0) {
            m_command[m_lastcommand].hasargs = true;
        } else {
            m_command[m_lastcommand].hasargs = false;
        }
        
        m_lastcommand += 1;
    }